

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O3

void __thiscall
mjs::number_object::do_debug_print_extra
          (number_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char *this_00;
  wstring local_60;
  wchar_t *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = (wchar_t *)local_30;
  std::__cxx11::wstring::_M_construct((ulong)&local_40,indent);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_40,local_38);
  this_00 = "[[Value]]: ";
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  number_to_string_abi_cxx11_(&local_60,(mjs *)this_00,this->value_);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::operator<<(pwVar1,"\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_40 != (wchar_t *)local_30) {
    operator_delete(local_40,local_30[0] * 4 + 4);
  }
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: " << number_to_string(value_) << "\n";
    }